

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_alphargbblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uint *src,int mapWidth,
               int mapHeight,int srcStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  QT_FT_Span *pQVar4;
  bool bVar5;
  QColorTrcLut *colorProfile;
  QRgba64 *pQVar6;
  int iVar7;
  ClipLine *pCVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long in_FS_OFFSET;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  QRgba64 srcColor;
  QRgba64 buffer [2048];
  uint *local_4098;
  QRgba64 local_4040;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)((long)&color->rgba + 6) != 0) {
    if (useGammaCorrection) {
      colorProfile = QGuiApplicationPrivate::colorProfileForA32Text(QGuiApplicationPrivate::self);
    }
    else {
      colorProfile = (QColorTrcLut *)0x0;
    }
    local_4040 = (QRgba64)color->rgba;
    uVar18 = (ushort)(local_4040.rgba >> 0x30);
    if (uVar18 == 0xffff && colorProfile != (QColorTrcLut *)0x0) {
      _Var1._M_head_impl =
           (colorProfile->m_toLinear)._M_t.
           super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
           super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      uVar19 = (ushort)(local_4040.rgba >> 0x10);
      uVar20 = (ushort)(local_4040.rgba >> 0x20);
      uVar18 = uVar18 - (uVar18 >> 8);
      local_4040.rgba =
           CONCAT26((uVar18 >> 8) + uVar18,
                    CONCAT24((_Var1._M_head_impl[(ushort)(uVar20 - (uVar20 >> 8)) >> 4] >> 8) +
                             _Var1._M_head_impl[(ushort)(uVar20 - (uVar20 >> 8)) >> 4],
                             CONCAT22((_Var1._M_head_impl[(ushort)(uVar19 - (uVar19 >> 8)) >> 4] >>
                                      8) + _Var1._M_head_impl[(ushort)(uVar19 - (uVar19 >> 8)) >> 4]
                                      ,(_Var1._M_head_impl
                                        [(ushort)((ushort)local_4040.rgba -
                                                 ((ushort)local_4040.rgba >> 8)) >> 4] >> 8) +
                                       _Var1._M_head_impl
                                       [(ushort)((ushort)local_4040.rgba -
                                                ((ushort)local_4040.rgba >> 8)) >> 4])));
    }
    p_Var2 = destFetchProc64[rasterBuffer->format];
    p_Var3 = destStoreProc64[rasterBuffer->format];
    if (clip == (QClipData *)0x0) {
      if (0 < mapHeight) {
        iVar7 = 0;
        local_4098 = src;
        do {
          if (0 < mapWidth) {
            iVar10 = x;
            uVar15 = mapWidth;
            do {
              uVar9 = 0x800;
              if ((int)uVar15 < 0x800) {
                uVar9 = uVar15;
              }
              pQVar6 = (*p_Var2)(local_4038,rasterBuffer,iVar10,y + iVar7,uVar9);
              if (0 < (int)uVar15) {
                uVar12 = 0;
                do {
                  alphargbblend_generic
                            (local_4098[(long)(iVar10 - x) + uVar12],pQVar6,(int)uVar12,&local_4040,
                             color,colorProfile);
                  uVar12 = uVar12 + 1;
                } while (uVar9 != uVar12);
              }
              if (p_Var3 != (DestStoreProc64)0x0) {
                (*p_Var3)(rasterBuffer,iVar10,y + iVar7,pQVar6,uVar9);
              }
              iVar10 = iVar10 + uVar9;
              uVar16 = uVar15 - uVar9;
              bVar5 = (int)uVar9 <= (int)uVar15;
              uVar15 = uVar16;
            } while (uVar16 != 0 && bVar5);
          }
          iVar7 = iVar7 + 1;
          local_4098 = local_4098 + srcStride;
        } while (iVar7 != mapHeight);
      }
    }
    else {
      uVar15 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        uVar15 = rasterBuffer->m_height;
      }
      uVar9 = 0;
      if (0 < y) {
        uVar9 = y;
      }
      QClipData::initialize(clip);
      if ((int)uVar9 < (int)uVar15) {
        uVar12 = (ulong)uVar9;
        local_4098 = src + ((long)(int)((uVar9 - y) * srcStride) - (long)x);
        do {
          if (0 < clip->m_clipLines[uVar12].count) {
            pCVar8 = clip->m_clipLines + uVar12;
            lVar17 = 0;
            do {
              pQVar4 = pCVar8->spans;
              iVar7 = pQVar4[lVar17].x;
              iVar10 = x;
              if (x < iVar7) {
                iVar10 = iVar7;
              }
              iVar13 = pQVar4[lVar17].len + iVar7;
              if (mapWidth + x < iVar13) {
                iVar13 = mapWidth + x;
              }
              iVar14 = iVar13 - iVar10;
              if (iVar14 != 0 && iVar10 <= iVar13) {
                pQVar6 = (*p_Var2)(local_4038,rasterBuffer,iVar10,pQVar4[lVar17].y,iVar14);
                if (iVar7 <= x) {
                  iVar7 = x;
                }
                lVar11 = 0;
                do {
                  alphargbblend_generic
                            (local_4098[iVar7 + lVar11],pQVar6,(int)lVar11,&local_4040,color,
                             colorProfile);
                  lVar11 = lVar11 + 1;
                } while (iVar13 - iVar7 != (int)lVar11);
                if (p_Var3 != (DestStoreProc64)0x0) {
                  (*p_Var3)(rasterBuffer,iVar10,pQVar4[lVar17].y,pQVar6,iVar14);
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < pCVar8->count);
          }
          uVar12 = uVar12 + 1;
          local_4098 = local_4098 + srcStride;
        } while (uVar12 != uVar15);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphargbblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uint *src, int mapWidth, int mapHeight, int srcStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA32Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                for (int j=0; j < l; ++j) {
                    const uint coverage = src[j + (i - x)];
                    alphargbblend_generic(coverage, dest, j, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            src += srcStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        src += (top - y) * srcStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);

                for (int xp=start; xp<end; ++xp) {
                    const uint coverage = src[xp - x];
                    alphargbblend_generic(coverage, dest, xp - start, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            src += srcStride;
        } // for (yp -> bottom)
    }
}